

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCache.cpp
# Opt level: O0

void xmrig::OclCache::save(cl_program program,string *fileName)

{
  cl_int cVar1;
  char *pcVar2;
  _Ios_Openmode in_ESI;
  bool bVar3;
  ofstream file_stream;
  char *data;
  vector<char,_std::allocator<char>_> binary;
  size_t size;
  size_t *in_stack_fffffffffffffd80;
  void *in_stack_fffffffffffffd88;
  _Ios_Openmode in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined8 in_stack_fffffffffffffd98;
  size_type __n;
  cl_program_info cVar4;
  cl_program in_stack_fffffffffffffda0;
  _cl_program *program_00;
  string local_258 [516];
  uint local_54;
  char *local_50;
  _cl_program local_31;
  vector<char,_std::allocator<char>_> local_30;
  size_type local_18;
  _Ios_Openmode local_10;
  
  local_18 = 0;
  local_10 = in_ESI;
  cVar1 = OclLib::getProgramInfo
                    (in_stack_fffffffffffffda0,
                     (cl_program_info)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                     CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                     in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  if (cVar1 == 0) {
    program_00 = &local_31;
    __n = local_18;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)program_00,__n,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    cVar4 = (cl_program_info)(__n >> 0x20);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    local_50 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x20e0f3);
    cVar1 = OclLib::getProgramInfo
                      (program_00,cVar4,
                       CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                       in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    bVar3 = cVar1 == 0;
    if (bVar3) {
      createDirectory();
      std::ofstream::ofstream(local_258);
      in_stack_fffffffffffffd90 = std::operator|(_S_out,_S_bin);
      std::ofstream::open(local_258,local_10);
      pcVar2 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x20e1d8);
      std::vector<char,_std::allocator<char>_>::size(&local_30);
      std::ostream::write((char *)local_258,(long)pcVar2);
      std::ofstream::close();
      std::ofstream::~ofstream(local_258);
    }
    local_54 = (uint)!bVar3;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)CONCAT44(cVar1,in_stack_fffffffffffffd90));
  }
  return;
}

Assistant:

void xmrig::OclCache::save(cl_program program, const std::string &fileName)
{
    size_t size = 0;
    if (OclLib::getProgramInfo(program, CL_PROGRAM_BINARY_SIZES, sizeof(size), &size) != CL_SUCCESS) {
        return;
    }

    std::vector<char> binary(size);

    char *data = binary.data();
    if (OclLib::getProgramInfo(program, CL_PROGRAM_BINARIES, sizeof(char *), &data) != CL_SUCCESS) {
        return;
    }

    createDirectory();

    std::ofstream file_stream;
    file_stream.open(fileName, std::ofstream::out | std::ofstream::binary);
    file_stream.write(binary.data(), static_cast<int64_t>(binary.size()));
    file_stream.close();
}